

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_Near_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_Near_Test *this)

{
  Fixed *pFVar1;
  int x;
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffe00;
  int local_1f4;
  AssertionResult local_1f0;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f4 = 1;
  local_1c8.m_message._M_dataplus._M_p._0_4_ = 2;
  iutest::internal::CmpHelperNear<int,int>
            (&local_1f0,(internal *)0x3149ec,"x","2",(char *)&local_198,&local_1f4,(int *)&local_1c8
             ,in_stack_fffffffffffffe00);
  if (local_1f0.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,local_1f4);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xef,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1f0);
    local_1f4 = 1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    local_1c8.m_message._M_dataplus._M_p._0_4_ = 2;
    iutest::internal::CmpHelperNear<int,int>
              (&local_1f0,(internal *)0x3149ec,"x","2",(char *)&local_198,&local_1f4,
               (int *)&local_1c8,in_stack_fffffffffffffe00);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,local_1f4);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xf1,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    local_1f4 = 1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    local_1c8.m_message._M_dataplus._M_p._0_4_ = 2;
    iutest::internal::CmpHelperNear<int,int>
              (&local_1f0,(internal *)0x3149ec,"x","2",(char *)&local_198,&local_1f4,
               (int *)&local_1c8,in_stack_fffffffffffffe00);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,local_1f4);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xf3,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    local_1f4 = 1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    local_1c8.m_message._M_dataplus._M_p._0_4_ = 2;
    iutest::internal::CmpHelperNear<int,int>
              (&local_1f0,(internal *)0x3149ec,"x","2",(char *)&local_198,&local_1f4,
               (int *)&local_1c8,in_stack_fffffffffffffe00);
    if (local_1f0.m_result != false) goto LAB_0030014b;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,local_1f4);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xf5,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_0030014b:
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

TEST(GTestSyntaxTest, Near)
{
    if( int x = 1 )
        ASSERT_NEAR(0, x, 2) << x;
    if( int x = 1 )
        EXPECT_NEAR(0, x, 2) << x;
    if( int x = 1 )
        INFORM_NEAR(0, x, 2) << x;
    if( int x = 1 )
        ASSUME_NEAR(0, x, 2) << x;
}